

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

void google::protobuf::compiler::ruby::GenerateField(FieldDescriptor *field,Printer *printer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  bool bVar1;
  FieldDescriptor FVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  FieldDescriptor *pFVar5;
  FieldDescriptor *this;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  string sStack_88;
  string local_68;
  string local_48;
  
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    pDVar4 = FieldDescriptor::message_type(field);
    pFVar5 = Descriptor::FindFieldByNumber(pDVar4,1);
    pDVar4 = FieldDescriptor::message_type(field);
    this = Descriptor::FindFieldByNumber(pDVar4,2);
    args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(field + 8);
    TypeName_abi_cxx11_(&sStack_88,(ruby *)pFVar5,field_01);
    TypeName_abi_cxx11_(&local_68,(ruby *)this,field_02);
    NumberToString<int>(&local_48,*(int *)(field + 4));
    io::Printer::
    Print<char[5],std::__cxx11::string,char[9],std::__cxx11::string,char[11],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,"map :$name$, :$key_type$, :$value_type$, $number$",(char (*) [5])0x3de831,
               args_1,(char (*) [9])0x40d29f,&sStack_88,(char (*) [11])0x40d390,&local_68,
               (char (*) [7])0x3f3265,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&sStack_88);
    CVar3 = FieldDescriptor::cpp_type(this);
    if (CVar3 == CPPTYPE_MESSAGE) {
      pDVar4 = FieldDescriptor::message_type(this);
    }
    else {
      CVar3 = FieldDescriptor::cpp_type(this);
      if (CVar3 != CPPTYPE_ENUM) goto LAB_002c831e;
      pDVar4 = (Descriptor *)FieldDescriptor::enum_type(this);
    }
    io::Printer::Print<char[8],std::__cxx11::string>
              (printer,", \"$subtype$\"\n",(char (*) [8])"subtype",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)(pDVar4 + 8) + 0x20));
  }
  else {
    LabelForField_abi_cxx11_(&sStack_88,(ruby *)field,field_00);
    io::Printer::Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string>
              (printer,"$label$ :$name$, ",(char (*) [6])"label",&sStack_88,(char (*) [5])0x3de831,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(field + 8));
    std::__cxx11::string::~string((string *)&sStack_88);
    TypeName_abi_cxx11_(&sStack_88,(ruby *)field,field_03);
    NumberToString<int>(&local_68,*(int *)(field + 4));
    io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,":$type$, $number$",(char (*) [5])0x42d84f,&sStack_88,(char (*) [7])0x3f3265,
               &local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&sStack_88);
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 == CPPTYPE_MESSAGE) {
      pDVar4 = FieldDescriptor::message_type(field);
LAB_002c829b:
      io::Printer::Print<char[8],std::__cxx11::string>
                (printer,", \"$subtype$\"",(char (*) [8])"subtype",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)(pDVar4 + 8) + 0x20));
      pFVar5 = extraout_RDX_00;
    }
    else {
      CVar3 = FieldDescriptor::cpp_type(field);
      pFVar5 = extraout_RDX;
      if (CVar3 == CPPTYPE_ENUM) {
        pDVar4 = (Descriptor *)FieldDescriptor::enum_type(field);
        goto LAB_002c829b;
      }
    }
    FVar2 = field[1];
    if (((byte)FVar2 & 1) != 0) {
      DefaultValueForField_abi_cxx11_(&sStack_88,(ruby *)field,pFVar5);
      io::Printer::Print<char[8],std::__cxx11::string>
                (printer,", default: $default$",(char (*) [8])0x3d4461,&sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      FVar2 = field[1];
    }
    if (((byte)FVar2 & 4) != 0) {
      io::Printer::Print<char[10],std::__cxx11::string>
                (printer,", json_name: \"$json_name$\"",(char (*) [10])0x42bc0b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)(((byte)field[3] & 0x70) * 2) + *(long *)(field + 8)));
    }
LAB_002c831e:
    io::Printer::Print<>(printer,"\n");
  }
  return;
}

Assistant:

void GenerateField(const FieldDescriptor* field, io::Printer* printer) {
  if (field->is_map()) {
    const FieldDescriptor* key_field =
        field->message_type()->FindFieldByNumber(1);
    const FieldDescriptor* value_field =
        field->message_type()->FindFieldByNumber(2);

    printer->Print(
      "map :$name$, :$key_type$, :$value_type$, $number$",
      "name", field->name(),
      "key_type", TypeName(key_field),
      "value_type", TypeName(value_field),
      "number", NumberToString(field->number()));

    if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", value_field->message_type()->full_name());
    } else if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", value_field->enum_type()->full_name());
    } else {
      printer->Print("\n");
    }
  } else {

    printer->Print(
      "$label$ :$name$, ",
      "label", LabelForField(field),
      "name", field->name());
    printer->Print(
      ":$type$, $number$",
      "type", TypeName(field),
      "number", NumberToString(field->number()));

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
        ", \"$subtype$\"",
       "subtype", field->message_type()->full_name());
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
        ", \"$subtype$\"",
        "subtype", field->enum_type()->full_name());
    }

    if (field->has_default_value()) {
      printer->Print(", default: $default$", "default",
                     DefaultValueForField(field));
    }

    if (field->has_json_name()) {
      printer->Print(", json_name: \"$json_name$\"", "json_name",
                    field->json_name());
    }

    printer->Print("\n");
  }
}